

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O0

bool cppcms::url_dispatcher::parse<point>
               (application *app,const_char_istream *p,cmatch *m,int group,point *v)

{
  byte bVar1;
  char *in_RSI;
  application *in_RDI;
  const_char_istream *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff68;
  int n;
  match_results<const_char_*> *in_stack_ffffffffffffff70;
  undefined8 local_78;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_1;
  
  booster::match_results<const_char_*>::operator[]
            (in_stack_ffffffffffffff70,(int)((ulong)in_stack_ffffffffffffff68 >> 0x20));
  booster::match_results<const_char_*>::operator[]
            (in_stack_ffffffffffffff70,(int)((ulong)local_48 >> 0x20));
  bVar1 = cppcms::url_dispatcher::validate_encoding(in_RDI,local_48,local_58);
  n = (int)((ulong)local_48 >> 0x20);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    booster::match_results<const_char_*>::operator[](in_stack_ffffffffffffff70,n);
    booster::match_results<const_char_*>::operator[](in_stack_ffffffffffffff70,n);
    util::const_char_istream::range((const_char_istream *)in_RDI,local_78,in_RSI);
    local_1 = parse_url_parameter<point>(in_stack_ffffffffffffff48,(point *)0x15b9ef);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static bool parse(application &app,util::const_char_istream &p,booster::cmatch const &m,int group,T &v)
		{
			if(!validate_encoding(app,m[group].first,m[group].second))
				return false;
			p.range(m[group].first,m[group].second);
			return parse_url_parameter(p,v);
		}